

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.hpp
# Opt level: O0

int __thiscall TasGrid::CustomTabulated::getNumPoints(CustomTabulated *this,int level)

{
  const_reference pvVar1;
  allocator<char> local_39;
  string local_38;
  int local_14;
  CustomTabulated *pCStack_10;
  int level_local;
  CustomTabulated *this_local;
  
  local_14 = level;
  pCStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"number of points",&local_39);
  checkLevel(this,level,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&this->num_nodes,(long)local_14);
  return *pvVar1;
}

Assistant:

int getNumPoints(int level) const{ checkLevel(level, "number of points"); return num_nodes[level]; }